

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

bool Js::JavascriptArray::IsInlineSegment(SparseArraySegmentBase *seg,JavascriptArray *pArr)

{
  code *pcVar1;
  bool bVar2;
  SparseArraySegmentBase *pSVar3;
  undefined4 *puVar4;
  
  if (seg == (SparseArraySegmentBase *)0x0) {
    return false;
  }
  bVar2 = VarIs<Js::JavascriptNativeArray,Js::JavascriptArray>(pArr);
  if (!bVar2) {
    pSVar3 = (pArr->head).ptr;
    if (pSVar3 == (SparseArraySegmentBase *)0x0) {
      return false;
    }
    return pSVar3->length < 0x41;
  }
  bVar2 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr);
  if (bVar2) {
    pSVar3 = &DetermineInlineHeadSegmentPointer<Js::JavascriptNativeFloatArray,0u,true>
                        ((JavascriptNativeFloatArray *)pArr)->super_SparseArraySegmentBase;
  }
  else {
    bVar2 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x22d,"(VarIs<JavascriptNativeIntArray>(pArr))",
                                  "VarIs<JavascriptNativeIntArray>(pArr)");
      if (!bVar2) goto LAB_00b6af4f;
      *puVar4 = 0;
    }
    pSVar3 = &DetermineInlineHeadSegmentPointer<Js::JavascriptNativeIntArray,0u,true>
                        ((JavascriptNativeIntArray *)pArr)->super_SparseArraySegmentBase;
  }
  if (pSVar3 == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x231,"(inlineHeadSegment)","inlineHeadSegment");
    if (!bVar2) {
LAB_00b6af4f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return pSVar3 == seg;
}

Assistant:

bool JavascriptArray::IsInlineSegment(SparseArraySegmentBase *seg, JavascriptArray *pArr)
    {
        if (seg == nullptr)
        {
            return false;
        }

        SparseArraySegmentBase* inlineHeadSegment = nullptr;
        if (VarIs<JavascriptNativeArray>(pArr))
        {
            if (VarIs<JavascriptNativeFloatArray>(pArr))
            {
                inlineHeadSegment = DetermineInlineHeadSegmentPointer<JavascriptNativeFloatArray, 0, true>((JavascriptNativeFloatArray*)pArr);
            }
            else
            {
                AssertOrFailFast(VarIs<JavascriptNativeIntArray>(pArr));
                inlineHeadSegment = DetermineInlineHeadSegmentPointer<JavascriptNativeIntArray, 0, true>((JavascriptNativeIntArray*)pArr);
            }

            Assert(inlineHeadSegment);
            return (seg == inlineHeadSegment);
        }

        // This will result in false positives. It is used because DetermineInlineHeadSegmentPointer
        // does not handle Arrays that change type e.g. from JavascriptNativeIntArray to JavascriptArray
        // This conversion in particular is problematic because JavascriptNativeIntArray is larger than JavascriptArray
        // so the returned head segment ptr never equals pArr->head. So we will default to using this and deal with
        // false positives. It is better than always doing a hard copy.
        return pArr->head != nullptr && HasInlineHeadSegment(pArr->head->length);
    }